

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_resolver_util_test.cc
# Opt level: O2

bool __thiscall
google::protobuf::util::anon_unknown_0::HasField
          (anon_unknown_0 *this,Type *type,Cardinality cardinality,Kind kind,string_view name,
          int number)

{
  Field *pFVar1;
  undefined4 in_register_0000000c;
  bool bVar2;
  string_view name_00;
  
  name_00._M_str = (Type *)CONCAT44(in_register_0000000c,kind);
  name_00._M_len = name._M_len;
  pFVar1 = FindField(this,name_00._M_str,name_00);
  if (((pFVar1 == (Field *)0x0) || ((pFVar1->field_0)._impl_.cardinality_ != (int)type)) ||
     ((pFVar1->field_0)._impl_.kind_ != cardinality)) {
    bVar2 = false;
  }
  else {
    bVar2 = (pFVar1->field_0)._impl_.number_ == (int)name._M_str;
  }
  return bVar2;
}

Assistant:

bool HasField(const Type& type, Field::Cardinality cardinality,
              Field::Kind kind, absl::string_view name, int number) {
  const Field* field = FindField(type, name);
  if (field == nullptr) {
    return false;
  }
  return field->cardinality() == cardinality && field->kind() == kind &&
         field->number() == number;
}